

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConstructSymbolTableVisitor.cpp
# Opt level: O3

void __thiscall
CConstructSymbolTableVisitor::Visit(CConstructSymbolTableVisitor *this,CProgram *stm)

{
  CClassList *pCVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  CMainClass *pCVar3;
  SymbolTable *this_01;
  shared_ptr<ClassInfo> local_20;
  
  pCVar1 = (stm->classList)._M_t.super___uniq_ptr_impl<CClassList,_std::default_delete<CClassList>_>
           ._M_t.super__Tuple_impl<0UL,_CClassList_*,_std::default_delete<CClassList>_>.
           super__Head_base<0UL,_CClassList_*,_false>._M_head_impl;
  if (pCVar1 != (CClassList *)0x0) {
    (*(code *)**(undefined8 **)&(pCVar1->super_IWrapper).super_PositionedNode)(pCVar1,this);
  }
  peVar2 = (this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (peVar2->iClass).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  this_00 = (peVar2->iClass).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  (peVar2->iClass).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pCVar3 = (stm->mainClass)._M_t.super___uniq_ptr_impl<CMainClass,_std::default_delete<CMainClass>_>
           ._M_t.super__Tuple_impl<0UL,_CMainClass_*,_std::default_delete<CMainClass>_>.
           super__Head_base<0UL,_CMainClass_*,_false>._M_head_impl;
  if (pCVar3 != (CMainClass *)0x0) {
    (*(code *)**(undefined8 **)&(pCVar3->super_IWrapper).super_PositionedNode)(pCVar3,this);
  }
  this_01 = (this->table).super___shared_ptr<SymbolTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar2 = (this->info).super___shared_ptr<FullInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_20.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (peVar2->iClass).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_20.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (peVar2->iClass).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_20.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_20.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_20.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_20.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_20.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                     ._M_pi)->_M_use_count + 1;
    }
  }
  SymbolTable::AddClass(this_01,&local_20);
  if (local_20.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  return;
}

Assistant:

void CConstructSymbolTableVisitor::Visit( CProgram &stm )
{
//	std::cout << "program\n";
	if( stm.classList ) {
		stm.classList->Accept( *this );
	}

	info->iClass = nullptr;
	if( stm.mainClass ) {
		stm.mainClass->Accept( *this );
	}
	table->AddClass( info->iClass );
}